

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

char * apprun_env_envp_entry_create(char *name_prefix,char *name,char *value)

{
  size_t sVar1;
  char *__dest;
  char *entry;
  uint size;
  char *value_local;
  char *name_local;
  char *name_prefix_local;
  
  entry._4_4_ = 0;
  if (name_prefix != (char *)0x0) {
    sVar1 = strlen(name_prefix);
    entry._4_4_ = (int)sVar1;
  }
  if (name != (char *)0x0) {
    sVar1 = strlen(name);
    entry._4_4_ = entry._4_4_ + (int)sVar1;
  }
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    entry._4_4_ = entry._4_4_ + (int)sVar1;
  }
  __dest = (char *)calloc((ulong)(entry._4_4_ + 2),1);
  if (name_prefix != (char *)0x0) {
    strcat(__dest,name_prefix);
  }
  if (name != (char *)0x0) {
    strcat(__dest,name);
  }
  strcat(__dest,"=");
  if (value != (char *)0x0) {
    strcat(__dest,value);
  }
  return __dest;
}

Assistant:

char *apprun_env_envp_entry_create(char const *name_prefix, char const *name, char const *value) {
    unsigned size = 0;
    if (name_prefix != NULL)
        size += strlen(name_prefix);
    if (name != NULL)
        size += strlen(name);
    if (value != NULL)
        size += strlen(value);

    // allocate enough space for '=' and the NULL termination
    char *entry = calloc(size + 2, sizeof(char));
    if (name_prefix)
        strcat(entry, name_prefix);

    if (name)
        strcat(entry, name);

    strcat(entry, "=");

    if (value)
        strcat(entry, value);

    return entry;
}